

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

void __thiscall
LongReadsMapper::LongReadsMapper
          (LongReadsMapper *this,SequenceDistanceGraph *_sdg,LongReadsDatastore *ds,uint8_t k,
          bool sat_index)

{
  undefined1 in_CL;
  pointer in_RDX;
  pointer in_RSI;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RDI;
  byte in_R8B;
  pointer *__new_size;
  
  (in_RDI->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = in_RSI;
  *(undefined4 *)
   &(in_RDI->
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = 200;
  *(undefined1 *)
   ((long)&(in_RDI->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + 4) = in_CL;
  *(undefined4 *)
   &(in_RDI->
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = 1000;
  *(undefined4 *)
   ((long)&(in_RDI->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0x32;
  *(undefined4 *)
   &in_RDI[1].
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 500;
  *(undefined4 *)
   ((long)&in_RDI[1].
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 4;
  *(undefined4 *)
   &in_RDI[1].
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0x3c;
  *(undefined4 *)
   ((long)&in_RDI[1].
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0x32;
  in_RDI[1].
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3f5e71);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x3f5e84);
  std::
  unordered_map<std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>,_std::hash<std::pair<long,_long>_>,_std::equal_to<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>_>
  ::unordered_map((unordered_map<std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>,_std::hash<std::pair<long,_long>_>,_std::equal_to<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>_>
                   *)0x3f5e97);
  __new_size = &in_RDI[6].
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)0x3f5ead);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x3f5ec3);
  *(byte *)&in_RDI[8].
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = in_R8B & 1;
  std::vector<Node,_std::allocator<Node>_>::size
            ((vector<Node,_std::allocator<Node>_> *)
             ((long)&(in_RDI->
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[2].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(in_RDI,(size_type)__new_size);
  return;
}

Assistant:

LongReadsMapper::LongReadsMapper(const SequenceDistanceGraph &_sdg, const LongReadsDatastore &ds, uint8_t k, bool sat_index)
        : sg(_sdg), k(k), datastore(ds), sat_kmer_index(sat_index) {
    reads_in_node.resize(sg.nodes.size());
}